

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> __p;
  bool bVar1;
  Result RVar2;
  TokenTypePair TVar3;
  Enum EVar4;
  long lVar5;
  allocator local_92;
  allocator local_91;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  _Head_base<0UL,_wabt::ModuleCommand_*,_false> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Location local_68;
  string local_48 [32];
  
  MakeUnique<wabt::Script>();
  TVar3 = PeekPair(this);
  bVar1 = anon_unknown_1::IsModuleField(TVar3);
  EVar4 = Error;
  if (bVar1) {
    MakeUnique<wabt::ModuleCommand>();
    GetLocation(&local_68,this);
    ((local_88._M_head_impl)->module).loc.field_1.field_1.offset =
         (size_t)local_68.field_1.field_1.offset;
    *(undefined8 *)((long)&((local_88._M_head_impl)->module).loc.field_1 + 8) =
         local_68.field_1._8_8_;
    ((local_88._M_head_impl)->module).loc.filename.data_ = local_68.filename.data_;
    ((local_88._M_head_impl)->module).loc.filename.size_ = local_68.filename.size_;
    RVar2 = ParseModuleFieldList(this,&(local_88._M_head_impl)->module);
    if (RVar2.enum_ != Error) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)script._M_t.
                    super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                    super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                    super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &local_88);
    }
    if (local_88._M_head_impl != (ModuleCommand *)0x0) {
      (*((local_88._M_head_impl)->super_CommandMixin<(wabt::CommandType)0>).super_Command.
        _vptr_Command[1])();
    }
joined_r0x0024028d:
    if (RVar2.enum_ == Error) goto LAB_00240354;
  }
  else {
    TVar3 = PeekPair(this);
    if (((TVar3._M_elems[0] == Lpar) && (TVar3._M_elems[1] < Result)) &&
       ((0x4846400fcU >> ((ulong)TVar3._M_elems >> 0x20 & 0x3f) & 1) != 0)) {
      RVar2 = ParseCommandList(this,(Script *)
                                    script._M_t.
                                    super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                                    .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,
                               (CommandPtrVector *)
                               script._M_t.
                               super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                               .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl);
      goto joined_r0x0024028d;
    }
    ConsumeIfLpar(this);
    std::__cxx11::string::string((string *)&local_68,"a module field",&local_91);
    std::__cxx11::string::string(local_48,"a command",&local_92);
    local_88._M_head_impl = (ModuleCommand *)0x0;
    uStack_80 = 0;
    local_78 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_68,&stack0xffffffffffffffd8);
    ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_88,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
    lVar5 = 0x20;
    do {
      std::__cxx11::string::_M_dispose();
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
  }
  RVar2 = Expect(this,Eof);
  __p = script;
  if ((RVar2.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
    super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
         (__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>)0x0;
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               (pointer)__p._M_t.
                        super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                        super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl);
    EVar4 = Ok;
  }
LAB_00240354:
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&script);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}